

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O2

void __thiscall json11::Json::Json(Json *this,bool value)

{
  statics();
  std::__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> *)this,
             &(&statics::s.t)[!value].
              super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

Json::Json(bool value)                 : m_ptr(value ? statics().t : statics().f) {}